

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O0

void __thiscall
IfNeuron::calibrate(IfNeuron *this,int isi,int spikes,int maxtime,NoiseSource *noises,
                   double increment,double decrement)

{
  ostream *poVar1;
  double dVar2;
  Matrix local_358;
  double local_258;
  double mean;
  int k;
  undefined1 local_240 [8];
  NullStream devnull;
  IntervalEstimator estimator;
  double dStack_40;
  int direction;
  double stepsize;
  double decrement_local;
  double increment_local;
  NoiseSource *noises_local;
  int maxtime_local;
  int spikes_local;
  int isi_local;
  IfNeuron *this_local;
  
  dStack_40 = 20.0;
  dVar2 = DifferentialEquation::getStartingValue(&this->ifneuronMembrane);
  this->ifneuronTheta = dVar2;
  estimator.xTime._4_4_ = 1;
  IntervalEstimator::IntervalEstimator
            ((IntervalEstimator *)&devnull.super_ostream.field_0x108,&EST_MEAN,
             &(this->super_SpikingNeuron).super_StochasticEventGenerator,
             (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
             super_StochasticProcess.super_TimeDependent.xTime);
  NullStream::NullStream((NullStream *)local_240);
  mean._0_4_ = 0;
  do {
    if (999 < mean._0_4_) {
LAB_0015672f:
      (*(this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
        super_StochasticProcess.super_Parametric._vptr_Parametric[0xd])
                (&(this->super_SpikingNeuron).super_StochasticEventGenerator);
      NullStream::~NullStream((NullStream *)local_240);
      IntervalEstimator::~IntervalEstimator((IntervalEstimator *)&devnull.super_ostream.field_0x108)
      ;
      return;
    }
    Time::run((this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
              super_StochasticProcess.super_TimeDependent.xTime,(long)spikes,
              &(this->super_SpikingNeuron).super_StochasticEventGenerator,(long)maxtime,
              (ostream *)local_240,true);
    ScalarEstimator::getEstimate
              (&local_358,(ScalarEstimator *)&devnull.super_ostream.field_0x108,&EST_MEAN);
    dVar2 = Matrix::to_d(&local_358);
    dVar2 = dVar2 / ((this->super_SpikingNeuron).super_StochasticEventGenerator.
                     super_StochasticVariable.super_StochasticProcess.super_TimeDependent.xTime)->dt
    ;
    Matrix::~Matrix(&local_358);
    local_258 = dVar2;
    if ((dVar2 == 0.0) && (!NAN(dVar2))) {
      local_258 = 1e+23;
    }
    if (dStack_40 < 1e-05) {
      poVar1 = std::operator<<((ostream *)&std::cout,"\ncalibrated neuron after ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,mean._0_4_);
      poVar1 = std::operator<<(poVar1," steps.\t\t\t\t\t");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      goto LAB_0015672f;
    }
    if ((double)isi <= local_258) {
      if (estimator.xTime._4_4_ == -1) {
        dStack_40 = decrement * dStack_40;
        estimator.xTime._4_4_ = 1;
      }
      else {
        dStack_40 = increment * dStack_40;
      }
    }
    else if (estimator.xTime._4_4_ == 1) {
      dStack_40 = decrement * dStack_40;
      estimator.xTime._4_4_ = -1;
    }
    else {
      dStack_40 = increment * dStack_40;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"\rthreshold: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->ifneuronTheta);
    poVar1 = std::operator<<(poVar1,", spike rate: ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,1.0 / (local_258 *
                                     ((this->super_SpikingNeuron).super_StochasticEventGenerator.
                                      super_StochasticVariable.super_StochasticProcess.
                                      super_TimeDependent.xTime)->dt));
    poVar1 = std::operator<<(poVar1," Hz, target rate: ");
    poVar1 = (ostream *)
             std::ostream::operator<<
                       (poVar1,1.0 / ((double)isi *
                                     ((this->super_SpikingNeuron).super_StochasticEventGenerator.
                                      super_StochasticVariable.super_StochasticProcess.
                                      super_TimeDependent.xTime)->dt));
    poVar1 = std::operator<<(poVar1," Hz, next correction: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(double)estimator.xTime._4_4_ * dStack_40);
    poVar1 = std::operator<<(poVar1,"\t\t\t");
    std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
    this->ifneuronTheta = -(double)estimator.xTime._4_4_ * dStack_40 + this->ifneuronTheta;
    mean._0_4_ = mean._0_4_ + 1;
  } while( true );
}

Assistant:

void IfNeuron::calibrate(int isi, int spikes, int maxtime, NoiseSource *noises, double increment, double decrement)
{
	double stepsize = 20.0; // starting stepsize
	ifneuronTheta = ifneuronMembrane.getStartingValue();
	int direction = 1; // current direction 1-up, -1-down

	// new interval estimator, measuring time in units
	IntervalEstimator estimator(EST_MEAN, this, xTime);
	
	NullStream devnull;
	
	for( int k=0; k<1000; k++) {
		
		// test fpt
		xTime->run( spikes, this, maxtime, devnull );
		double mean = estimator.getEstimate(EST_MEAN).to_d() / xTime->dt;
		if( mean==0.0 ) mean = 1e23;
		
		// early stopping
		if( stepsize<0.00001 ) {
			cout << "\ncalibrated neuron after " << k << " steps.\t\t\t\t\t" << endl;
			break;
		}
	
		// adjust threshold
		if(mean < isi) {
			if (direction == 1) {
				// mean too large and direction up - decrease stepsize and turn
				stepsize *= decrement;
				direction *= -1;
			} else {
				// mean too large and direction down - increase stepsize and go on
				stepsize *= increment;
			}
		} else {
			if (direction == -1) {
				// mean too small and direction down - decrease stepsize and turn
				stepsize *= decrement;
				direction *= -1;
			} else {
				// mean too small and direction up - increase stepsize and go on
				stepsize *= increment;
			}
		}
		
		// note to the user
		cout << "\rthreshold: " << ifneuronTheta << ", spike rate: " << 1.0/(mean*xTime->dt) << " Hz, target rate: " << 1.0/(isi*xTime->dt) << " Hz, next correction: " << direction*stepsize << "\t\t\t" << flush;

		// apply correction
		ifneuronTheta -= direction * stepsize;
	}
	
	init();
}